

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::UntypedMapBase::GetValue<google::protobuf::MessageLite>
          (UntypedMapBase *this,NodeBase *node)

{
  if ((byte)(this->type_info_).field_0x3 >> 4 == 6) {
    return (MessageLite *)((long)&node->next + (ulong)(this->type_info_).value_offset);
  }
  GetValue<google::protobuf::MessageLite>();
}

Assistant:

T* GetValue(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.value_type));
    return reinterpret_cast<T*>(GetVoidValue(node));
  }